

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O3

word luckyCanonicizer_final_fast_6Vars1(word InOut,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  word wVar2;
  word local_28;
  
  local_28 = InOut;
  uVar1 = Kit_TruthSemiCanonicize_Yasha1(&local_28,6,pCanonPerm,pStore);
  *pCanonPhase = uVar1;
  local_28 = Extra_Truth6MinimumRoundMany1(local_28,pStore,pCanonPerm,pCanonPhase);
  Kit_TruthChangePhase_64bit(&local_28,6,5);
  Kit_TruthChangePhase_64bit(&local_28,6,4);
  Kit_TruthChangePhase_64bit(&local_28,6,3);
  Kit_TruthChangePhase_64bit(&local_28,6,2);
  Kit_TruthChangePhase_64bit(&local_28,6,1);
  Kit_TruthChangePhase_64bit(&local_28,6,0);
  *(byte *)pCanonPhase = (byte)*pCanonPhase ^ 0x3f;
  wVar2 = Extra_Truth6MinimumRoundMany1(local_28,pStore,pCanonPerm,pCanonPhase);
  return wVar2;
}

Assistant:

word luckyCanonicizer_final_fast_6Vars1(word InOut, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    (* pCanonPhase) = Kit_TruthSemiCanonicize_Yasha1( &InOut, 6, pCanonPerm, pStore);
    InOut = Extra_Truth6MinimumRoundMany1(InOut, pStore, pCanonPerm, pCanonPhase);
    Kit_TruthChangePhase_64bit( &InOut, 6, 5 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 4 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 3 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 2 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 1 );        
    Kit_TruthChangePhase_64bit( &InOut, 6, 0 );
    (*pCanonPhase) ^= 0x3F;
    return Extra_Truth6MinimumRoundMany1(InOut, pStore, pCanonPerm, pCanonPhase); 
}